

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.H
# Opt level: O3

void __thiscall
amrex::EB2::
GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::CylinderIF,_amrex::EB2::CylinderIF>,_int>_>
::define_fine(GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::CylinderIF,_amrex::EB2::CylinderIF>,_int>_>
              *this,GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::CylinderIF,_amrex::EB2::CylinderIF>,_int>
                    *gshop,Geometry *geom,int max_grid_size,int ngrow,bool extend_domain_face,
             int num_crse_opt)

{
  Box *pBVar1;
  BoxArray *this_00;
  DistributionMapping *dm;
  MultiGFab *fabarray_;
  FabArray<amrex::EBCellFlagFab> *this_01;
  MultiFab *this_02;
  MultiFab *this_03;
  MultiFab *this_04;
  MultiFab *this_05;
  MultiFab *this_06;
  int *piVar2;
  GFab *this_07;
  IntVect *pIVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  pointer pGVar8;
  char cVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  void *pvVar12;
  size_type sVar13;
  FabArray<amrex::FArrayBox> *pFVar14;
  _Map_pointer ppbVar15;
  size_t sVar16;
  bool bVar17;
  int i;
  int iVar18;
  int iVar19;
  Box *pBVar20;
  long lVar21;
  long lVar22;
  pointer pBVar23;
  int *piVar24;
  Arena *arena;
  uint uVar25;
  ulong uVar26;
  long *plVar27;
  BaseFab<double> *this_08;
  uint uVar28;
  undefined7 in_register_00000089;
  long lVar29;
  IntVect *domlo;
  int iVar30;
  long lVar31;
  long lVar32;
  iterator *piVar33;
  double dVar34;
  initializer_list<std::reference_wrapper<int>_> __l;
  Periodicity PVar35;
  bool cover_multiple_cuts;
  FabArray<amrex::FArrayBox> *local_ed8;
  int nmulticuts;
  int nsmallcells;
  int maxiter;
  undefined4 local_ec0;
  int nmc;
  FabArray<amrex::FArrayBox> *local_eb8;
  int nsm;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  Box lhs;
  int local_e78 [2];
  int local_e70;
  Vector<int,_std::allocator<int>_> *local_e58;
  BoxList covered_boxes;
  BoxList cut_boxes;
  IntVect crse_ratio;
  undefined4 uStack_dd4;
  Box result;
  _Rb_tree<amrex::Box,_std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>,_std::_Select1st<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_>,_std::less<amrex::Box>,_std::allocator<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_>_>
  local_d40;
  Box bounding_box;
  Real small_volfrac;
  Array4<double> local_cc8;
  Box local_c88;
  undefined1 local_c68 [8];
  undefined8 uStack_c60;
  ParmParse pp;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c00;
  int local_bf8;
  int local_bf4;
  int local_bf0;
  int local_bec;
  int local_be8;
  int local_be4;
  double *local_bb8;
  float local_bb0;
  Box local_bac [8];
  Box bx;
  undefined4 uStack_aac;
  Array4<const_unsigned_int> local_a00;
  Array4<const_unsigned_int> local_9c0;
  Array4<const_unsigned_int> local_980;
  MFInfo mf_info;
  Array4<amrex::EBCellFlag> local_8c8;
  Array4<double> local_888;
  Array4<double> local_848;
  undefined1 local_808 [40];
  int iStack_7e0;
  int iStack_7d4;
  int iStack_7d0;
  Array4<double> local_7c8;
  Array4<amrex::EBCellFlag> local_788;
  IntVect edge_type;
  undefined4 uStack_73c;
  undefined1 local_738 [64];
  element_type *local_6f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_6f0;
  element_type *peStack_6e8;
  double *local_6c8;
  pointer piStack_6c0;
  pointer local_6b8;
  _Bit_type *p_Stack_6b0;
  Dim3 aDStack_6a8 [18];
  Array4<const_double> local_5c8;
  undefined1 local_588 [32];
  Dim3 local_568;
  Dim3 local_55c;
  int local_550;
  Array4<unsigned_int> local_548;
  Array4<unsigned_int> local_508;
  Array4<unsigned_int> local_4c8;
  GpuArray<double,_3U> local_488;
  GpuArray<double,_3U> local_468;
  Box local_448;
  vector<std::reference_wrapper<int>,_std::allocator<std::reference_wrapper<int>_>_> local_420;
  Array4<double> local_408;
  Array4<double> local_3c8;
  Array4<double> local_388;
  Array4<const_double> local_348;
  Array4<const_double> local_308;
  Array4<const_double> local_2c8;
  Array4<const_double> local_288;
  Array4<double> local_248;
  Array4<double> local_208;
  Array4<double> local_1c8;
  Elixir cellflagtmp_eli;
  Array4<double> local_170;
  Array4<double> local_130;
  Array4<double> local_f0;
  Array4<double> local_b0;
  Array4<double> local_70;
  
  local_ed8 = (FabArray<amrex::FArrayBox> *)geom;
  local_eb8 = (FabArray<amrex::FArrayBox> *)gshop;
  iVar18 = Verbose();
  local_ec0 = (undefined4)CONCAT71(in_register_00000089,extend_domain_face);
  if (0 < iVar18 && !extend_domain_face) {
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map_size = (size_t)OutStream();
    piVar33 = &pp.m_pstack.c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)piVar33);
    *(undefined8 *)
     ((long)&pp.m_pstack.c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_first +
     pp.m_pstack.c.
     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Deque_impl_data._M_start._M_cur[-1]._M_string_length) =
         *(undefined8 *)
          (pp.m_pstack.c.
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_map_size + 8 +
          *(long *)(*(long *)pp.m_pstack.c.
                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_map_size + -0x18));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)piVar33,"AMReX WARNING: extend_domain_face=false is not recommended!\n",
               0x3c);
    Print::~Print((Print *)&pp);
  }
  small_volfrac = 1e-14;
  cover_multiple_cuts = false;
  maxiter = 0x20;
  edge_type.vect._0_8_ = local_738;
  std::__cxx11::string::_M_construct<char_const*>((string *)&edge_type,"eb2","");
  ParmParse::ParmParse(&pp,(string *)&edge_type);
  if ((undefined1 *)edge_type.vect._0_8_ != local_738) {
    operator_delete((void *)edge_type.vect._0_8_,local_738._0_8_ + 1);
  }
  ParmParse::queryAdd<double,_0>(&pp,"small_volfrac",&small_volfrac);
  ParmParse::queryAdd<bool,_0>(&pp,"cover_multiple_cuts",&cover_multiple_cuts);
  ParmParse::queryAdd<int,_0>(&pp,"maxiter",&maxiter);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&pp);
  dVar34 = ceil((double)ngrow * 0.0625);
  pFVar14 = local_ed8;
  iVar18 = (int)dVar34 << 4;
  (this->super_Level).m_ngrow.vect[0] = iVar18;
  (this->super_Level).m_ngrow.vect[1] = iVar18;
  (this->super_Level).m_ngrow.vect[2] = iVar18;
  uVar4 = *(undefined8 *)
           ((long)&(local_ed8->super_FabArrayBase).ownership.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base._M_p + 4);
  uVar10 = *(undefined8 *)
            &(local_ed8->super_FabArrayBase).ownership.super__Bvector_base<std::allocator<bool>_>.
             _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base.field_0xc;
  uVar11 = *(undefined8 *)(local_ed8->super_FabArrayBase).n_grow.vect;
  local_c88.bigend.vect[1] =
       (int)((ulong)(local_ed8->super_FabArrayBase).ownership.
                    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                    _M_end_of_storage >> 0x20);
  local_c88.bigend.vect[2] = (int)uVar11;
  local_c88.btype.itype = (uint)((ulong)uVar11 >> 0x20);
  local_c88.smallend.vect[2] = (int)uVar10;
  local_c88.bigend.vect[0] = (int)((ulong)uVar10 >> 0x20);
  local_c88.smallend.vect[0] = (int)uVar4;
  iVar18 = 0;
  if (*(char *)((long)&(local_ed8->super_FabArrayBase).boxarray.m_ref.
                       super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1) ==
      '\0') {
    iVar18 = (local_c88.bigend.vect[0] - local_c88.smallend.vect[0]) + 1;
    iVar30 = (this->super_Level).m_ngrow.vect[0];
    if (iVar30 <= iVar18) {
      iVar18 = iVar30;
    }
  }
  (this->super_Level).m_ngrow.vect[0] = iVar18;
  local_c88.smallend.vect[1] = (int)((ulong)uVar4 >> 0x20);
  iVar18 = 0;
  if (*(char *)((long)&(local_ed8->super_FabArrayBase).boxarray.m_ref.
                       super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 2) ==
      '\0') {
    iVar18 = (local_c88.bigend.vect[1] - local_c88.smallend.vect[1]) + 1;
    iVar30 = (this->super_Level).m_ngrow.vect[1];
    if (iVar30 <= iVar18) {
      iVar18 = iVar30;
    }
  }
  pBVar1 = (Box *)((long)&(local_ed8->super_FabArrayBase).ownership.
                          super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p + 4);
  (this->super_Level).m_ngrow.vect[1] = iVar18;
  iVar18 = 0;
  if (*(char *)((long)&(local_ed8->super_FabArrayBase).boxarray.m_ref.
                       super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 3) ==
      '\0') {
    iVar18 = (local_c88.bigend.vect[2] - local_c88.smallend.vect[2]) + 1;
    iVar30 = (this->super_Level).m_ngrow.vect[2];
    if (iVar30 <= iVar18) {
      iVar18 = iVar30;
    }
  }
  (this->super_Level).m_ngrow.vect[2] = iVar18;
  iVar18 = (this->super_Level).m_ngrow.vect[0];
  iVar30 = (this->super_Level).m_ngrow.vect[1];
  iVar5 = (this->super_Level).m_ngrow.vect[2];
  local_c88.smallend.vect[1] = local_c88.smallend.vect[1] - iVar30;
  local_c88.smallend.vect[0] = local_c88.smallend.vect[0] - iVar18;
  local_c88.smallend.vect[2] = local_c88.smallend.vect[2] - iVar5;
  local_c88.bigend.vect[0] = iVar18 + local_c88.bigend.vect[0];
  local_c88.bigend.vect[1] = local_c88.bigend.vect[1] + iVar30;
  local_c88.bigend.vect[2] = local_c88.bigend.vect[2] + iVar5;
  pBVar20 = &local_c88;
  if ((char)local_ec0 != '\0') {
    pBVar20 = pBVar1;
  }
  uVar4 = *(undefined8 *)((pBVar20->smallend).vect + 2);
  bounding_box.btype.itype = (pBVar20->btype).itype;
  bounding_box.bigend.vect[1] = (pBVar20->bigend).vect[1];
  bounding_box.bigend.vect[2] = (pBVar20->bigend).vect[2];
  bounding_box.smallend.vect._0_8_ = *(undefined8 *)(pBVar20->smallend).vect;
  bounding_box.smallend.vect[2] = (int)uVar4;
  bounding_box.bigend.vect[0] = (int)((ulong)uVar4 >> 0x20);
  lVar21 = 0;
  do {
    if ((bounding_box.btype.itype >> ((uint)lVar21 & 0x1f) & 1) == 0) {
      piVar24 = bounding_box.bigend.vect + lVar21;
      *piVar24 = *piVar24 + 1;
    }
    lVar21 = lVar21 + 1;
  } while (lVar21 != 3);
  bounding_box.btype.itype = 7;
  BoxList::BoxList(&cut_boxes);
  BoxList::BoxList(&covered_boxes);
  iVar18 = *(int *)(ParallelContext::frames + 0x10);
  lVar21 = (long)*(int *)(ParallelContext::frames + 0xc);
  iVar30 = 8;
  if (num_crse_opt < 8) {
    iVar30 = num_crse_opt;
  }
  if (iVar30 < 1) {
    iVar30 = 0;
  }
  do {
    crse_ratio.vect[1] = 1 << ((byte)iVar30 & 0x1f);
    crse_ratio.vect[0] = crse_ratio.vect[1];
    stack0xfffffffffffff228 = CONCAT44(uStack_dd4,crse_ratio.vect[1]);
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map_size._0_4_ = 1;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x100000001;
    bVar17 = Box::coarsenable(pBVar1,&crse_ratio,(IntVect *)&pp);
    if (bVar17) {
      result.bigend.vect[1] = bounding_box.bigend.vect[1];
      result.bigend.vect[2] = bounding_box.bigend.vect[2];
      result.btype = bounding_box.btype;
      result.smallend.vect[0] = bounding_box.smallend.vect[0];
      result.smallend.vect[1] = bounding_box.smallend.vect[1];
      uVar4 = result.smallend.vect._0_8_;
      result.smallend.vect[2] = bounding_box.smallend.vect[2];
      result.bigend.vect[0] = bounding_box.bigend.vect[0];
      result.smallend.vect[1] = bounding_box.smallend.vect[1];
      uVar25 = result.smallend.vect[1];
      if (crse_ratio.vect[1] == 1 && crse_ratio.vect[0] == 1) {
        result.smallend.vect._0_8_ = uVar4;
        if (crse_ratio.vect[2] != 1) goto LAB_0032b41b;
      }
      else {
        result.smallend.vect[0] = bounding_box.smallend.vect[0];
        if (crse_ratio.vect[0] != 1) {
          if (crse_ratio.vect[0] == 4) {
            if (result.smallend.vect[0] < 0) {
              result.smallend.vect[0] = result.smallend.vect[0] >> 2;
            }
            else {
              result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 2;
            }
          }
          else if (crse_ratio.vect[0] == 2) {
            if (result.smallend.vect[0] < 0) {
              result.smallend.vect[0] = result.smallend.vect[0] >> 1;
            }
            else {
              result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 1;
            }
          }
          else if (result.smallend.vect[0] < 0) {
            result.smallend.vect[0] = ~(~result.smallend.vect[0] / crse_ratio.vect[0]);
          }
          else {
            result.smallend.vect[0] = result.smallend.vect[0] / crse_ratio.vect[0];
          }
        }
        if (crse_ratio.vect[1] != 1) {
          if (crse_ratio.vect[1] == 4) {
            if ((long)bounding_box.smallend.vect._0_8_ < 0) {
              uVar25 = result.smallend.vect[1] >> 2;
            }
            else {
              uVar25 = (uint)result.smallend.vect[1] >> 2;
            }
          }
          else if (crse_ratio.vect[1] == 2) {
            if ((long)bounding_box.smallend.vect._0_8_ < 0) {
              uVar25 = result.smallend.vect[1] >> 1;
            }
            else {
              uVar25 = (uint)result.smallend.vect[1] >> 1;
            }
          }
          else if ((long)bounding_box.smallend.vect._0_8_ < 0) {
            uVar25 = ~(~result.smallend.vect[1] / crse_ratio.vect[1]);
          }
          else {
            uVar25 = result.smallend.vect[1] / crse_ratio.vect[1];
          }
        }
LAB_0032b41b:
        result.smallend.vect[1] = uVar25;
        if (crse_ratio.vect[2] != 1) {
          if (crse_ratio.vect[2] == 4) {
            if (bounding_box.smallend.vect[2] < 0) {
              result.smallend.vect[2] = bounding_box.smallend.vect[2] >> 2;
            }
            else {
              result.smallend.vect[2] = (uint)bounding_box.smallend.vect[2] >> 2;
            }
          }
          else if (crse_ratio.vect[2] == 2) {
            if (bounding_box.smallend.vect[2] < 0) {
              result.smallend.vect[2] = bounding_box.smallend.vect[2] >> 1;
            }
            else {
              result.smallend.vect[2] = (uint)bounding_box.smallend.vect[2] >> 1;
            }
          }
          else if (bounding_box.smallend.vect[2] < 0) {
            result.smallend.vect[2] = ~(~bounding_box.smallend.vect[2] / crse_ratio.vect[2]);
          }
          else {
            result.smallend.vect[2] = bounding_box.smallend.vect[2] / crse_ratio.vect[2];
          }
        }
        if (bounding_box.btype.itype == 0) {
          if (crse_ratio.vect[0] != 1) {
            if (crse_ratio.vect[0] == 4) {
              result.bigend.vect[0] = bounding_box.bigend.vect[0] >> 2;
              if (-1 < bounding_box.bigend.vect[0]) {
                result.bigend.vect[0] = (uint)bounding_box.bigend.vect[0] >> 2;
              }
            }
            else if (crse_ratio.vect[0] == 2) {
              result.bigend.vect[0] = bounding_box.bigend.vect[0] >> 1;
              if (-1 < bounding_box.bigend.vect[0]) {
                result.bigend.vect[0] = (uint)bounding_box.bigend.vect[0] >> 1;
              }
            }
            else if (bounding_box.bigend.vect[0] < 0) {
              result.bigend.vect[0] = ~(~bounding_box.bigend.vect[0] / crse_ratio.vect[0]);
            }
            else {
              result.bigend.vect[0] = bounding_box.bigend.vect[0] / crse_ratio.vect[0];
            }
          }
          if (crse_ratio.vect[1] != 1) {
            if (crse_ratio.vect[1] == 4) {
              result.bigend.vect[1] = bounding_box.bigend.vect[1] >> 2;
              if (-1 < bounding_box.bigend.vect[1]) {
                result.bigend.vect[1] = (uint)bounding_box.bigend.vect[1] >> 2;
              }
            }
            else if (crse_ratio.vect[1] == 2) {
              result.bigend.vect[1] = bounding_box.bigend.vect[1] >> 1;
              if (-1 < bounding_box.bigend.vect[1]) {
                result.bigend.vect[1] = (uint)bounding_box.bigend.vect[1] >> 1;
              }
            }
            else if (bounding_box.bigend.vect[1] < 0) {
              result.bigend.vect[1] = ~(~bounding_box.bigend.vect[1] / crse_ratio.vect[1]);
            }
            else {
              result.bigend.vect[1] = bounding_box.bigend.vect[1] / crse_ratio.vect[1];
            }
          }
          if (crse_ratio.vect[2] != 1) {
            if (crse_ratio.vect[2] == 4) {
              result.bigend.vect[2] = bounding_box.bigend.vect[2] >> 2;
              if (-1 < bounding_box.bigend.vect[2]) {
                result.bigend.vect[2] = (uint)bounding_box.bigend.vect[2] >> 2;
              }
            }
            else if (crse_ratio.vect[2] == 2) {
              result.bigend.vect[2] = bounding_box.bigend.vect[2] >> 1;
              if (-1 < bounding_box.bigend.vect[2]) {
                result.bigend.vect[2] = (uint)bounding_box.bigend.vect[2] >> 1;
              }
            }
            else if (bounding_box.bigend.vect[2] < 0) {
              result.bigend.vect[2] = ~(~bounding_box.bigend.vect[2] / crse_ratio.vect[2]);
            }
            else {
              result.bigend.vect[2] = bounding_box.bigend.vect[2] / crse_ratio.vect[2];
            }
          }
        }
        else {
          pp.m_pstack.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._0_12_ = ZEXT812(0);
          lVar29 = 0;
          do {
            if (((bounding_box.btype.itype >> ((uint)lVar29 & 0x1f) & 1) != 0) &&
               (result.bigend.vect[lVar29] % crse_ratio.vect[lVar29] != 0)) {
              *(undefined4 *)
               ((long)&pp.m_pstack.c.
                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_map + lVar29 * 4) = 1;
            }
            lVar29 = lVar29 + 1;
          } while (lVar29 != 3);
          if (crse_ratio.vect[0] != 1) {
            if (crse_ratio.vect[0] == 4) {
              result.bigend.vect[0] = bounding_box.bigend.vect[0] >> 2;
              if (-1 < bounding_box.bigend.vect[0]) {
                result.bigend.vect[0] = (uint)bounding_box.bigend.vect[0] >> 2;
              }
            }
            else if (crse_ratio.vect[0] == 2) {
              result.bigend.vect[0] = bounding_box.bigend.vect[0] >> 1;
              if (-1 < bounding_box.bigend.vect[0]) {
                result.bigend.vect[0] = (uint)bounding_box.bigend.vect[0] >> 1;
              }
            }
            else if (bounding_box.bigend.vect[0] < 0) {
              result.bigend.vect[0] = ~(~bounding_box.bigend.vect[0] / crse_ratio.vect[0]);
            }
            else {
              result.bigend.vect[0] = bounding_box.bigend.vect[0] / crse_ratio.vect[0];
            }
          }
          if (crse_ratio.vect[1] != 1) {
            if (crse_ratio.vect[1] == 4) {
              result.bigend.vect[1] = bounding_box.bigend.vect[1] >> 2;
              if (-1 < bounding_box.bigend.vect[1]) {
                result.bigend.vect[1] = (uint)bounding_box.bigend.vect[1] >> 2;
              }
            }
            else if (crse_ratio.vect[1] == 2) {
              result.bigend.vect[1] = bounding_box.bigend.vect[1] >> 1;
              if (-1 < bounding_box.bigend.vect[1]) {
                result.bigend.vect[1] = (uint)bounding_box.bigend.vect[1] >> 1;
              }
            }
            else if (bounding_box.bigend.vect[1] < 0) {
              result.bigend.vect[1] = ~(~bounding_box.bigend.vect[1] / crse_ratio.vect[1]);
            }
            else {
              result.bigend.vect[1] = bounding_box.bigend.vect[1] / crse_ratio.vect[1];
            }
          }
          if (crse_ratio.vect[2] != 1) {
            if (crse_ratio.vect[2] == 4) {
              result.bigend.vect[2] = bounding_box.bigend.vect[2] >> 2;
              if (-1 < bounding_box.bigend.vect[2]) {
                result.bigend.vect[2] = (uint)bounding_box.bigend.vect[2] >> 2;
              }
            }
            else if (crse_ratio.vect[2] == 2) {
              result.bigend.vect[2] = bounding_box.bigend.vect[2] >> 1;
              if (-1 < bounding_box.bigend.vect[2]) {
                result.bigend.vect[2] = (uint)bounding_box.bigend.vect[2] >> 1;
              }
            }
            else if (bounding_box.bigend.vect[2] < 0) {
              result.bigend.vect[2] = ~(~bounding_box.bigend.vect[2] / crse_ratio.vect[2]);
            }
            else {
              result.bigend.vect[2] = bounding_box.bigend.vect[2] / crse_ratio.vect[2];
            }
          }
          result.bigend.vect[0] =
               result.bigend.vect[0] +
               (int)pp.m_pstack.c.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map;
          result.bigend.vect[1] =
               result.bigend.vect[1] +
               pp.m_pstack.c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_map._4_4_;
          result.bigend.vect[2] =
               result.bigend.vect[2] +
               (int)pp.m_pstack.c.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map_size;
        }
      }
      memcpy((Geometry *)&pp,local_ed8,200);
      Geometry::coarsen((Geometry *)&pp,&crse_ratio);
      BoxList::BoxList((BoxList *)&edge_type);
      if (cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_start ==
          cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        BoxList::clear(&covered_boxes);
        BoxList::BoxList((BoxList *)&bx,local_bac);
        uVar10 = edge_type.vect._0_8_;
        uVar4._4_4_ = bx.smallend.vect[1];
        uVar4._0_4_ = bx.smallend.vect[0];
        unique0x100028df = (pointer)CONCAT44(bx.bigend.vect[0],bx.smallend.vect[2]);
        sVar13 = CONCAT44(bx.bigend.vect[2],bx.bigend.vect[1]);
        bx.smallend.vect[0] = 0;
        bx.smallend.vect[1] = 0;
        bx.smallend.vect[2] = 0;
        bx.bigend.vect[0] = 0;
        bx.bigend.vect[1] = 0;
        bx.bigend.vect[2] = 0;
        if (edge_type.vect._0_8_ == 0) {
          local_738._8_4_ = bx.btype.itype;
          edge_type.vect._0_8_ = uVar4;
          local_738._0_8_ = sVar13;
        }
        else {
          uVar26 = local_738._0_8_ - edge_type.vect._0_8_;
          edge_type.vect._0_8_ = uVar4;
          local_738._0_8_ = sVar13;
          operator_delete((void *)uVar10,uVar26);
          pvVar12 = (void *)CONCAT44(bx.smallend.vect[1],bx.smallend.vect[0]);
          local_738._8_4_ = bx.btype.itype;
          if (pvVar12 != (void *)0x0) {
            operator_delete(pvVar12,CONCAT44(bx.bigend.vect[2],bx.bigend.vect[1]) - (long)pvVar12);
          }
        }
      }
      else {
        BoxList::swap((BoxList *)&edge_type,&cut_boxes);
        BoxList::coarsen((BoxList *)&edge_type,&crse_ratio);
      }
      BoxList::maxSize((BoxList *)&edge_type,max_grid_size);
      iVar6 = result.bigend.vect[0];
      iVar5 = result.smallend.vect[2];
      lVar29 = (long)stack0xfffffffffffff8c0 - edge_type.vect._0_8_ >> 2;
      lVar31 = lVar29 * 0x6db6db6db6db6db7;
      if (lVar31 - lVar21 != 0 && lVar21 <= lVar31) {
        local_ea8._0_4_ = result.smallend.vect[0];
        local_ea8._4_4_ = result.smallend.vect[1];
        uStack_ea0 = 0;
        local_c68 = (undefined1  [8])CONCAT44(result.bigend.vect[2],result.bigend.vect[1]);
        uStack_c60 = 0;
        lVar32 = lVar21;
        do {
          lVar22 = lVar32 * 0x1c;
          piVar24 = (int *)(edge_type.vect._0_8_ + lVar22);
          uVar25 = *(uint *)(edge_type.vect._0_8_ + 0x18 + lVar22);
          piVar2 = (int *)(edge_type.vect._0_8_ + lVar22);
          iVar19 = piVar2[2];
          bx.smallend.vect[0] = *piVar2 - 1;
          bx.smallend.vect[1] = piVar2[1] - 1;
          bx.smallend.vect[2] = iVar19 + -1;
          bx.bigend.vect[0] = piVar2[3] + 1;
          uVar4 = *(undefined8 *)(edge_type.vect._0_8_ + 0x10 + lVar22);
          bx.bigend.vect[1] = (int)uVar4 + 1;
          bx.bigend.vect[2] = (int)((ulong)uVar4 >> 0x20) + 1;
          bx.btype.itype = uVar25;
          lVar22 = 0;
          do {
            if ((uVar25 >> ((uint)lVar22 & 0x1f) & 1) == 0) {
              piVar2 = bx.bigend.vect + lVar22;
              *piVar2 = *piVar2 + 1;
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 != 3);
          stack0xfffffffffffff550 = CONCAT44(uStack_aac,7);
          lhs.btype.itype = 7;
          lhs.smallend.vect[1] =
               ~-(uint)((int)local_ea8._4_4_ < bx.smallend.vect[1]) & local_ea8._4_4_ |
               bx.smallend.vect[1] & -(uint)((int)local_ea8._4_4_ < bx.smallend.vect[1]);
          lhs.smallend.vect[0] =
               ~-(uint)((int)(uint)local_ea8 < bx.smallend.vect[0]) & (uint)local_ea8 |
               bx.smallend.vect[0] & -(uint)((int)(uint)local_ea8 < bx.smallend.vect[0]);
          lhs.smallend.vect[2] = bx.smallend.vect[2];
          if (iVar19 + -1 <= iVar5) {
            lhs.smallend.vect[2] = iVar5;
          }
          lhs.bigend.vect[0] = bx.bigend.vect[0];
          if (iVar6 <= bx.bigend.vect[0]) {
            lhs.bigend.vect[0] = iVar6;
          }
          lhs.bigend.vect[1] =
               ~-(uint)(bx.bigend.vect[1] < (int)local_c68._0_4_) & local_c68._0_4_ |
               bx.bigend.vect[1] & -(uint)(bx.bigend.vect[1] < (int)local_c68._0_4_);
          lhs.bigend.vect[2] =
               ~-(uint)(bx.bigend.vect[2] < (int)local_c68._4_4_) & local_c68._4_4_ |
               bx.bigend.vect[2] & -(uint)(bx.bigend.vect[2] < (int)local_c68._4_4_);
          iVar19 = GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::CylinderIF,_amrex::EB2::CylinderIF>,_int>
                   ::getBoxType_Cpu((GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::CylinderIF,_amrex::EB2::CylinderIF>,_int>
                                     *)local_eb8,&lhs,(Geometry *)&pp);
          if (iVar19 == 0) {
            lhs.smallend.vect._0_8_ = *(undefined8 *)piVar24;
            lhs.bigend.vect[1] = piVar24[4];
            lhs.bigend.vect[2] = piVar24[5];
            lhs.btype.itype = piVar24[6];
            lhs.smallend.vect[2] = (int)*(undefined8 *)(piVar24 + 2);
            lhs.bigend.vect[0] = (int)((ulong)*(undefined8 *)(piVar24 + 2) >> 0x20);
            if (crse_ratio.vect[2] != 1 || (crse_ratio.vect[1] != 1 || crse_ratio.vect[0] != 1)) {
              uVar25 = (uint)((lhs.btype.itype & 2) == 0);
              lhs.smallend.vect[1] = lhs.smallend.vect[1] * crse_ratio.vect[1];
              lhs.smallend.vect[0] = lhs.smallend.vect[0] * crse_ratio.vect[0];
              lhs.smallend.vect[2] = lhs.smallend.vect[2] * crse_ratio.vect[2];
              uVar28 = (uint)((lhs.btype.itype & 4) == 0);
              lhs.bigend.vect[0] =
                   (lhs.bigend.vect[0] + (~lhs.btype.itype & 1)) * crse_ratio.vect[0] -
                   (~lhs.btype.itype & 1);
              lhs.bigend.vect[1] = (lhs.bigend.vect[1] + uVar25) * crse_ratio.vect[1] - uVar25;
              lhs.bigend.vect[2] = (lhs.bigend.vect[2] + uVar28) * crse_ratio.vect[2] - uVar28;
            }
            if (cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<amrex::Box,std::allocator<amrex::Box>>::
              _M_realloc_insert<amrex::Box_const&>
                        ((vector<amrex::Box,std::allocator<amrex::Box>> *)&cut_boxes,
                         (iterator)
                         cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                         super__Vector_impl_data._M_finish,&lhs);
            }
            else {
              *(ulong *)((cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_finish)->bigend).vect =
                   CONCAT44(lhs.bigend.vect[1],lhs.bigend.vect[0]);
              *(ulong *)(((cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_finish)->bigend).vect + 2) =
                   CONCAT44(lhs.btype.itype,lhs.bigend.vect[2]);
              *(undefined8 *)
               ((cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish)->smallend).vect = lhs.smallend.vect._0_8_;
              *(ulong *)(((cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_finish)->smallend).vect + 2) =
                   CONCAT44(lhs.bigend.vect[0],lhs.smallend.vect[2]);
              cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          else if (iVar19 == 1) {
            lhs.smallend.vect._0_8_ = *(undefined8 *)piVar24;
            lhs.bigend.vect[1] = piVar24[4];
            lhs.bigend.vect[2] = piVar24[5];
            lhs.btype.itype = piVar24[6];
            lhs.smallend.vect[2] = (int)*(undefined8 *)(piVar24 + 2);
            lhs.bigend.vect[0] = (int)((ulong)*(undefined8 *)(piVar24 + 2) >> 0x20);
            if (crse_ratio.vect[2] != 1 || (crse_ratio.vect[1] != 1 || crse_ratio.vect[0] != 1)) {
              uVar25 = (uint)((lhs.btype.itype & 2) == 0);
              lhs.smallend.vect[1] = lhs.smallend.vect[1] * crse_ratio.vect[1];
              lhs.smallend.vect[0] = lhs.smallend.vect[0] * crse_ratio.vect[0];
              lhs.smallend.vect[2] = lhs.smallend.vect[2] * crse_ratio.vect[2];
              uVar28 = (uint)((lhs.btype.itype & 4) == 0);
              lhs.bigend.vect[0] =
                   (lhs.bigend.vect[0] + (~lhs.btype.itype & 1)) * crse_ratio.vect[0] -
                   (~lhs.btype.itype & 1);
              lhs.bigend.vect[1] = (lhs.bigend.vect[1] + uVar25) * crse_ratio.vect[1] - uVar25;
              lhs.bigend.vect[2] = (lhs.bigend.vect[2] + uVar28) * crse_ratio.vect[2] - uVar28;
            }
            if (covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<amrex::Box,std::allocator<amrex::Box>>::
              _M_realloc_insert<amrex::Box_const&>
                        ((vector<amrex::Box,std::allocator<amrex::Box>> *)&covered_boxes,
                         (iterator)
                         covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                         super__Vector_impl_data._M_finish,&lhs);
            }
            else {
              *(ulong *)((covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                          .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_finish)->bigend).vect =
                   CONCAT44(lhs.bigend.vect[1],lhs.bigend.vect[0]);
              *(ulong *)(((covered_boxes.m_lbox.
                           super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_finish)->bigend).vect + 2) =
                   CONCAT44(lhs.btype.itype,lhs.bigend.vect[2]);
              *(undefined8 *)
               ((covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish)->smallend).vect = lhs.smallend.vect._0_8_;
              *(ulong *)(((covered_boxes.m_lbox.
                           super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_finish)->smallend).vect + 2) =
                   CONCAT44(lhs.bigend.vect[0],lhs.smallend.vect[2]);
              covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          lVar32 = lVar32 + iVar18;
        } while (SBORROW8(lVar32,lVar31) != lVar32 + lVar29 * -0x6db6db6db6db6db7 < 0);
      }
      AllGatherBoxes(&cut_boxes.m_lbox,0);
      if (edge_type.vect._0_8_ != 0) {
        operator_delete((void *)edge_type.vect._0_8_,local_738._0_8_ - edge_type.vect._0_8_);
      }
    }
    bVar17 = 0 < iVar30;
    iVar30 = iVar30 + -1;
  } while (bVar17);
  AllGatherBoxes(&covered_boxes.m_lbox,0);
  pBVar23 = covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((((this->super_Level).m_ngrow.vect[0] == 0) && ((this->super_Level).m_ngrow.vect[1] == 0)) &&
     ((this->super_Level).m_ngrow.vect[2] == 0)) {
LAB_0032bd28:
    if (cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_finish) goto LAB_0032bd4f;
  }
  else {
    for (; pBVar23 !=
           covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish; pBVar23 = pBVar23 + 1) {
      lVar21 = 0;
      do {
        iVar18 = (this->super_Level).m_ngrow.vect[lVar21];
        if (iVar18 != 0) {
          iVar30 = (pBVar23->smallend).vect[lVar21];
          if (iVar30 == (pBVar1->smallend).vect[lVar21]) {
            (pBVar23->smallend).vect[lVar21] = iVar30 - iVar18;
          }
          iVar18 = (pBVar23->bigend).vect[lVar21];
          if (iVar18 == *(int *)((long)(&(pFVar14->super_FabArrayBase).n_grow + -1) + lVar21 * 4 + 4
                                )) {
            (pBVar23->bigend).vect[lVar21] = iVar18 + (this->super_Level).m_ngrow.vect[lVar21];
          }
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != 3);
    }
    pBVar23 = cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      do {
        lVar21 = 0;
        do {
          iVar18 = (this->super_Level).m_ngrow.vect[lVar21];
          if (iVar18 != 0) {
            iVar30 = (pBVar23->smallend).vect[lVar21];
            if (iVar30 == (pBVar1->smallend).vect[lVar21]) {
              (pBVar23->smallend).vect[lVar21] = iVar30 - iVar18;
            }
            iVar18 = (pBVar23->bigend).vect[lVar21];
            if (iVar18 == *(int *)((long)(&(pFVar14->super_FabArrayBase).n_grow + -1) +
                                  lVar21 * 4 + 4)) {
              (pBVar23->bigend).vect[lVar21] = iVar18 + (this->super_Level).m_ngrow.vect[lVar21];
            }
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 != 3);
        pBVar23 = pBVar23 + 1;
      } while (pBVar23 !=
               cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish);
      goto LAB_0032bd28;
    }
LAB_0032bd4f:
    if (covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_finish) goto LAB_0032bdc5;
    Abort_host("AMReX_EB2_Level.H: Domain is completely covered");
  }
  if (covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    if (2 < num_crse_opt) {
      BoxList::maxSize(&covered_boxes,max_grid_size << 2);
    }
    BoxArray::BoxArray((BoxArray *)&pp,&covered_boxes);
    BoxArray::operator=(&(this->super_Level).m_covered_grids,(BoxArray *)&pp);
    BoxArray::~BoxArray((BoxArray *)&pp);
  }
LAB_0032bdc5:
  if (cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    BoxArray::BoxArray((BoxArray *)&pp);
    BoxArray::operator=(&(this->super_Level).m_grids,(BoxArray *)&pp);
    BoxArray::~BoxArray((BoxArray *)&pp);
    DistributionMapping::DistributionMapping((DistributionMapping *)&pp);
    ppbVar15 = pp.m_pstack.c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_map;
    sVar16 = pp.m_pstack.c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_map_size;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map_size = 0;
    p_Var7 = (this->super_Level).m_dmap.m_ref.
             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->super_Level).m_dmap.m_ref.
    super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)ppbVar15;
    (this->super_Level).m_dmap.m_ref.
    super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar16;
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
      if (pp.m_pstack.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_map_size != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   pp.m_pstack.c.
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_map_size);
      }
    }
    (this->super_Level).m_allregular = true;
    (this->super_Level).m_ok = true;
  }
  else {
    BoxArray::BoxArray((BoxArray *)&pp,&cut_boxes);
    this_00 = &(this->super_Level).m_grids;
    BoxArray::operator=(this_00,(BoxArray *)&pp);
    BoxArray::~BoxArray((BoxArray *)&pp);
    DistributionMapping::DistributionMapping
              ((DistributionMapping *)&pp,this_00,*(int *)(ParallelContext::frames + 0x10));
    dm = &(this->super_Level).m_dmap;
    ppbVar15 = pp.m_pstack.c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_map;
    sVar16 = pp.m_pstack.c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_map_size;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map_size = 0;
    p_Var7 = (this->super_Level).m_dmap.m_ref.
             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->super_Level).m_dmap.m_ref.
    super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)ppbVar15;
    (this->super_Level).m_dmap.m_ref.
    super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar16;
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
      if (pp.m_pstack.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_map_size != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   pp.m_pstack.c.
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_map_size);
      }
    }
    fabarray_ = &(this->super_Level).m_mgf;
    MultiGFab::define(fabarray_,this_00,dm);
    mf_info.alloc = true;
    mf_info.arena = (Arena *)0x0;
    mf_info.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    mf_info.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    mf_info.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    MFInfo::SetTag(&mf_info,"EB2::Level");
    this_01 = &(this->super_Level).m_cellflag;
    edge_type.vect._0_8_ = &PTR__FabFactory_0080c088;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map_size._0_4_ = 2;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x200000002;
    (*(this->super_Level).m_cellflag.super_FabArrayBase._vptr_FabArrayBase[3])
              (this_01,this_00,dm,1,&pp,&mf_info,&edge_type);
    this_02 = &(this->super_Level).m_volfrac;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&PTR__FabFactory_0080b918;
    MultiFab::define(this_02,this_00,dm,1,2,&mf_info,(FabFactory<amrex::FArrayBox> *)&pp);
    this_03 = &(this->super_Level).m_centroid;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&PTR__FabFactory_0080b918;
    MultiFab::define(this_03,this_00,dm,3,2,&mf_info,(FabFactory<amrex::FArrayBox> *)&pp);
    this_04 = &(this->super_Level).m_bndryarea;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&PTR__FabFactory_0080b918;
    MultiFab::define(this_04,this_00,dm,1,2,&mf_info,(FabFactory<amrex::FArrayBox> *)&pp);
    this_05 = &(this->super_Level).m_bndrycent;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&PTR__FabFactory_0080b918;
    MultiFab::define(this_05,this_00,dm,3,2,&mf_info,(FabFactory<amrex::FArrayBox> *)&pp);
    this_06 = &(this->super_Level).m_bndrynorm;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&PTR__FabFactory_0080b918;
    MultiFab::define(this_06,this_00,dm,3,2,&mf_info,(FabFactory<amrex::FArrayBox> *)&pp);
    local_c68 = (undefined1  [8])&(this->super_Level).m_edgecent;
    lVar29 = 0;
    lVar21 = 0;
    do {
      iVar18 = (int)lVar21;
      if (iVar18 == 1) {
        iVar30 = 0;
        edge_type.vect[0] = 0;
        edge_type.vect[1] = 1;
      }
      else if (iVar18 == 0) {
        edge_type.vect[0] = 1;
        edge_type.vect[1] = 0;
        iVar30 = 0;
      }
      else {
        iVar30 = 1;
        edge_type.vect[0] = 0;
        edge_type.vect[1] = 0;
      }
      edge_type.vect[2] = iVar30;
      convert((BoxArray *)&pp,this_00,&edge_type);
      plVar27 = (long *)((long)&(this->super_Level).m_areafrac._M_elems[0].
                                super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                                _vptr_FabArrayBase + lVar29);
      bx.smallend.vect[0] = 0x80b918;
      bx.smallend.vect[1] = 0;
      (**(code **)(*plVar27 + 0x10))(plVar27,(BoxArray *)&pp,dm,1,2,&mf_info,&bx);
      BoxArray::~BoxArray((BoxArray *)&pp);
      if (iVar18 == 1) {
        edge_type.vect[2] = 0;
        edge_type.vect[0] = 0;
        edge_type.vect[1] = 1;
      }
      else if (iVar18 == 0) {
        edge_type.vect[0] = 1;
        edge_type.vect[1] = 0;
        edge_type.vect[2] = 0;
      }
      else {
        edge_type.vect[2] = 1;
        edge_type.vect[0] = 0;
        edge_type.vect[1] = 0;
      }
      convert((BoxArray *)&pp,this_00,&edge_type);
      plVar27 = (long *)((long)&(this->super_Level).m_facecent._M_elems[0].
                                super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                                _vptr_FabArrayBase + lVar29);
      bx.smallend.vect[0] = 0x80b918;
      bx.smallend.vect[1] = 0;
      (**(code **)(*plVar27 + 0x10))(plVar27,(BoxArray *)&pp,dm,2,2,&mf_info,&bx);
      BoxArray::~BoxArray((BoxArray *)&pp);
      edge_type.vect[0] = 1;
      edge_type.vect[1] = 1;
      stack0xfffffffffffff8c0 = (pointer)CONCAT44(uStack_73c,1);
      edge_type.vect[lVar21] = 0;
      convert((BoxArray *)&pp,this_00,&edge_type);
      plVar27 = (long *)((long)&(this->super_Level).m_edgecent._M_elems[0].
                                super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                                _vptr_FabArrayBase + lVar29);
      bx.smallend.vect[0] = 0x80b918;
      bx.smallend.vect[1] = 0;
      (**(code **)(*plVar27 + 0x10))(plVar27,(BoxArray *)&pp,dm,1,2,&mf_info,&bx);
      BoxArray::~BoxArray((BoxArray *)&pp);
      lVar21 = lVar21 + 1;
      lVar29 = lVar29 + 0x180;
    } while (lVar29 != 0x480);
    local_468.arr[0] = *(Real *)((long)&(local_ed8->super_FabArrayBase).boxarray.m_bat.m_op + 0x14);
    local_468.arr[1] = *(Real *)((long)&(local_ed8->super_FabArrayBase).boxarray.m_bat.m_op + 0x1c);
    local_468.arr[2] = *(Real *)((long)&(local_ed8->super_FabArrayBase).boxarray.m_bat.m_op + 0x24);
    local_488.arr[0] =
         (double)(local_ed8->super_FabArrayBase).boxarray.m_ref.
                 super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_488.arr[1] =
         (double)(local_ed8->super_FabArrayBase).boxarray.m_simplified_list.
                 super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_488.arr[2] =
         (double)(local_ed8->super_FabArrayBase).boxarray.m_simplified_list.
                 super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    lVar21 = 0;
    do {
      if (((char)local_ec0 == '\0') ||
         (*(char *)((long)(&(local_ed8->super_FabArrayBase).n_grow + -10) + lVar21 + 9) == '\x01'))
      {
        piVar24 = bounding_box.smallend.vect + lVar21;
        *piVar24 = *piVar24 + -2;
        piVar24 = bounding_box.bigend.vect + lVar21;
        *piVar24 = *piVar24 + 2;
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 != 3);
    if (maxiter < 1) {
      local_ea8 = 0;
    }
    else {
      local_ea8 = 0;
      do {
        nsmallcells = 0;
        nmulticuts = 0;
        lVar21 = 0x24;
        do {
          *(undefined1 (*) [16])((long)local_c88.bigend.vect + lVar21 + 8) = (undefined1  [16])0x0;
          *(undefined ***)((long)local_c88.bigend.vect + lVar21) = &PTR__BaseFab_0080bbd8;
          *(undefined8 *)(local_c68 + lVar21 + 4) = 0x100000001;
          *(undefined4 *)((long)&uStack_c60 + lVar21 + 4) = 1;
          *(undefined1 (*) [16])
           ((long)&pp.m_pstack.c.
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_map + lVar21) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])
           ((long)&pp.m_pstack.c.
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_map_size + lVar21 + 6) = (undefined1  [16])0x0
          ;
          lVar21 = lVar21 + 0x48;
        } while (lVar21 != 0xfc);
        result.smallend.vect[2] = 0;
        result.bigend.vect[0] = 0;
        result.bigend.vect[1] = 0;
        result.bigend.vect[2] = 0;
        result.btype.itype = 1;
        result.smallend.vect._0_8_ = &PTR__EBCellFlagFab_0080c0f0;
        local_d40._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_d40._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_d40._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_d40._M_impl.super__Rb_tree_header._M_header;
        local_d40._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_d40._M_impl.super__Rb_tree_header._M_header._M_right =
             local_d40._M_impl.super__Rb_tree_header._M_header._M_left;
        MFIter::MFIter((MFIter *)&lhs,(FabArrayBase *)fabarray_,'\0');
        if (local_e78[0] < local_e70) {
          do {
            iVar18 = local_e78[0];
            if (local_e58 != (Vector<int,_std::allocator<int>_> *)0x0) {
              iVar18 = (local_e58->super_vector<int,_std::allocator<int>_>).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[local_e78[0]];
            }
            pGVar8 = (this->super_Level).m_mgf.super_LayoutData<amrex::EB2::GFab>.m_data.
                     super_vector<amrex::EB2::GFab,_std::allocator<amrex::EB2::GFab>_>.
                     super__Vector_base<amrex::EB2::GFab,_std::allocator<amrex::EB2::GFab>_>._M_impl
                     .super__Vector_impl_data._M_start;
            this_07 = pGVar8 + iVar18;
            uVar4 = *(undefined8 *)(pGVar8[iVar18].m_validbox.smallend.vect + 2);
            pIVar3 = &pGVar8[iVar18].m_validbox.bigend;
            local_448.bigend.vect[1] = (int)((ulong)*(undefined8 *)pIVar3->vect >> 0x20);
            local_448._20_8_ = *(undefined8 *)(pIVar3->vect + 2);
            local_448.smallend.vect._0_8_ = *(undefined8 *)&pGVar8[iVar18].m_validbox.smallend;
            local_448.smallend.vect[2] = (int)uVar4;
            local_448.bigend.vect[0] = (int)((ulong)uVar4 >> 0x20);
            if ((uint)local_ea8 == 0) {
              GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::CylinderIF,_amrex::EB2::CylinderIF>,_int>
              ::
              fillFab<amrex::EB2::DifferenceIF<amrex::EB2::CylinderIF,_amrex::EB2::CylinderIF>,_nullptr>
                        ((GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::CylinderIF,_amrex::EB2::CylinderIF>,_int>
                          *)local_eb8,&this_07->m_levelset,(Geometry *)local_ed8,Cpu,&bounding_box);
            }
            piVar24 = local_e78;
            if (local_e58 != (Vector<int,_std::allocator<int>_> *)0x0) {
              piVar24 = (local_e58->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + local_e78[0];
            }
            GFab::buildTypes(this_07,(this->super_Level).m_cellflag.m_fabs_v.
                                     super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[*piVar24]);
            crse_ratio.vect._0_8_ = (this_07->m_levelset).dptr;
            register0x00000080 =
                 ((long)(this_07->m_levelset).domain.bigend.vect[0] -
                 (long)(this_07->m_levelset).domain.smallend.vect[0]) + 1;
            local_cc8.p = (this_07->m_levelset).dptr;
            local_cc8.ncomp = (this_07->m_levelset).nvar;
            pBVar1 = &(this_07->m_levelset).domain;
            local_cc8.begin.z = (this_07->m_levelset).domain.smallend.vect[2];
            local_cc8.begin.x = (pBVar1->smallend).vect[0];
            local_cc8.begin.y = (pBVar1->smallend).vect[1];
            lVar21 = (long)(this_07->m_levelset).domain.bigend.vect[1] + 1;
            lVar29 = (long)(this_07->m_levelset).domain.bigend.vect[0];
            lVar31 = (long)(this_07->m_levelset).domain.bigend.vect[2] + 1;
            local_cc8.jstride = (lVar29 - (pBVar1->smallend).vect[0]) + 1;
            local_cc8.kstride =
                 (lVar21 - (this_07->m_levelset).domain.smallend.vect[1]) * local_cc8.jstride;
            local_cc8.nstride = (lVar31 - local_cc8.begin.z) * local_cc8.kstride;
            local_cc8.end._0_8_ = lVar29 + 1U & 0xffffffff | lVar21 << 0x20;
            local_cc8.end.z = (int)lVar31;
            FabArray<amrex::EBCellFlagFab>::array<amrex::EBCellFlagFab,_0>
                      (&local_788,this_01,(MFIter *)&lhs);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (&local_70,&this_02->super_FabArray<amrex::FArrayBox>,(MFIter *)&lhs);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (&local_b0,&this_03->super_FabArray<amrex::FArrayBox>,(MFIter *)&lhs);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (&local_f0,&this_04->super_FabArray<amrex::FArrayBox>,(MFIter *)&lhs);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (&local_130,&this_05->super_FabArray<amrex::FArrayBox>,(MFIter *)&lhs);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (&local_170,&this_06->super_FabArray<amrex::FArrayBox>,(MFIter *)&lhs);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (&local_1c8,(FabArray<amrex::FArrayBox> *)&(this->super_Level).m_areafrac,
                       (MFIter *)&lhs);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (&local_208,
                       &(this->super_Level).m_areafrac._M_elems[1].super_FabArray<amrex::FArrayBox>,
                       (MFIter *)&lhs);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (&local_248,
                       &(this->super_Level).m_areafrac._M_elems[2].super_FabArray<amrex::FArrayBox>,
                       (MFIter *)&lhs);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (&local_388,(FabArray<amrex::FArrayBox> *)&(this->super_Level).m_facecent,
                       (MFIter *)&lhs);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (&local_3c8,
                       &(this->super_Level).m_facecent._M_elems[1].super_FabArray<amrex::FArrayBox>,
                       (MFIter *)&lhs);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (&local_408,
                       &(this->super_Level).m_facecent._M_elems[2].super_FabArray<amrex::FArrayBox>,
                       (MFIter *)&lhs);
            local_4c8.p = (this_07->m_facetype)._M_elems[0].dptr;
            local_4c8.ncomp = (this_07->m_facetype)._M_elems[0].nvar;
            pBVar1 = &(this_07->m_facetype)._M_elems[0].domain;
            local_4c8.begin.z = (this_07->m_facetype)._M_elems[0].domain.smallend.vect[2];
            local_4c8.begin.x = (pBVar1->smallend).vect[0];
            local_4c8.begin.y = (pBVar1->smallend).vect[1];
            lVar21 = (long)(this_07->m_facetype)._M_elems[0].domain.bigend.vect[1] + 1;
            lVar29 = (long)(this_07->m_facetype)._M_elems[0].domain.bigend.vect[0];
            lVar31 = (long)(this_07->m_facetype)._M_elems[0].domain.bigend.vect[2] + 1;
            local_4c8.jstride = (lVar29 - (pBVar1->smallend).vect[0]) + 1;
            local_4c8.kstride =
                 (lVar21 - (this_07->m_facetype)._M_elems[0].domain.smallend.vect[1]) *
                 local_4c8.jstride;
            local_4c8.nstride = (lVar31 - local_4c8.begin.z) * local_4c8.kstride;
            local_4c8.end._0_8_ = lVar29 + 1U & 0xffffffff | lVar21 << 0x20;
            local_4c8.end.z = (int)lVar31;
            local_508.p = (this_07->m_facetype)._M_elems[1].dptr;
            local_508.ncomp = (this_07->m_facetype)._M_elems[1].nvar;
            pBVar1 = &(this_07->m_facetype)._M_elems[1].domain;
            local_508.begin.z = (this_07->m_facetype)._M_elems[1].domain.smallend.vect[2];
            local_508.begin.x = (pBVar1->smallend).vect[0];
            local_508.begin.y = (pBVar1->smallend).vect[1];
            lVar21 = (long)(this_07->m_facetype)._M_elems[1].domain.bigend.vect[1] + 1;
            lVar29 = (long)(this_07->m_facetype)._M_elems[1].domain.bigend.vect[0];
            lVar31 = (long)(this_07->m_facetype)._M_elems[1].domain.bigend.vect[2] + 1;
            local_508.jstride = (lVar29 - (pBVar1->smallend).vect[0]) + 1;
            local_508.kstride =
                 (lVar21 - (this_07->m_facetype)._M_elems[1].domain.smallend.vect[1]) *
                 local_508.jstride;
            local_508.nstride = (lVar31 - local_508.begin.z) * local_508.kstride;
            local_508.end._0_8_ = lVar29 + 1U & 0xffffffff | lVar21 << 0x20;
            local_508.end.z = (int)lVar31;
            local_548.p = (this_07->m_facetype)._M_elems[2].dptr;
            local_548.ncomp = (this_07->m_facetype)._M_elems[2].nvar;
            pBVar1 = &(this_07->m_facetype)._M_elems[2].domain;
            local_548.begin.z = (this_07->m_facetype)._M_elems[2].domain.smallend.vect[2];
            local_548.begin.x = (pBVar1->smallend).vect[0];
            local_548.begin.y = (pBVar1->smallend).vect[1];
            lVar21 = (long)(this_07->m_facetype)._M_elems[2].domain.bigend.vect[1] + 1;
            lVar29 = (long)(this_07->m_facetype)._M_elems[2].domain.bigend.vect[0];
            lVar31 = (long)(this_07->m_facetype)._M_elems[2].domain.bigend.vect[2] + 1;
            local_548.jstride = (lVar29 - (pBVar1->smallend).vect[0]) + 1;
            local_548.kstride =
                 (lVar21 - (this_07->m_facetype)._M_elems[2].domain.smallend.vect[1]) *
                 local_548.jstride;
            local_548.nstride = (lVar31 - local_548.begin.z) * local_548.kstride;
            local_548.end._0_8_ = lVar29 + 1U & 0xffffffff | lVar21 << 0x20;
            local_548.end.z = (int)lVar31;
            nmc = 0;
            nsm = 0;
            local_980.p = (this_07->m_edgetype)._M_elems[0].dptr;
            local_980.ncomp = (this_07->m_edgetype)._M_elems[0].nvar;
            pBVar1 = &(this_07->m_edgetype)._M_elems[0].domain;
            local_980.begin.z = (this_07->m_edgetype)._M_elems[0].domain.smallend.vect[2];
            local_980.begin.x = (pBVar1->smallend).vect[0];
            local_980.begin.y = (pBVar1->smallend).vect[1];
            lVar21 = (long)(this_07->m_edgetype)._M_elems[0].domain.bigend.vect[1] + 1;
            local_980.end.x = (this_07->m_edgetype)._M_elems[0].domain.bigend.vect[0];
            lVar29 = (long)(this_07->m_edgetype)._M_elems[0].domain.bigend.vect[2] + 1;
            local_980.jstride = ((long)local_980.end.x - (long)(pBVar1->smallend).vect[0]) + 1;
            local_980.end.x = local_980.end.x + 1;
            local_980.kstride =
                 (lVar21 - (this_07->m_edgetype)._M_elems[0].domain.smallend.vect[1]) *
                 local_980.jstride;
            local_980.nstride = (lVar29 - local_980.begin.z) * local_980.kstride;
            local_980.end.y = (int)lVar21;
            local_980.end.z = (int)lVar29;
            local_9c0.p = (this_07->m_edgetype)._M_elems[1].dptr;
            local_9c0.ncomp = (this_07->m_edgetype)._M_elems[1].nvar;
            pBVar1 = &(this_07->m_edgetype)._M_elems[1].domain;
            local_9c0.begin.z = (this_07->m_edgetype)._M_elems[1].domain.smallend.vect[2];
            local_9c0.begin.x = (pBVar1->smallend).vect[0];
            local_9c0.begin.y = (pBVar1->smallend).vect[1];
            lVar21 = (long)(this_07->m_edgetype)._M_elems[1].domain.bigend.vect[1] + 1;
            local_9c0.end.x = (this_07->m_edgetype)._M_elems[1].domain.bigend.vect[0];
            lVar29 = (long)(this_07->m_edgetype)._M_elems[1].domain.bigend.vect[2] + 1;
            local_9c0.jstride = ((long)local_9c0.end.x - (long)(pBVar1->smallend).vect[0]) + 1;
            local_9c0.end.x = local_9c0.end.x + 1;
            local_9c0.kstride =
                 (lVar21 - (this_07->m_edgetype)._M_elems[1].domain.smallend.vect[1]) *
                 local_9c0.jstride;
            local_9c0.nstride = (lVar29 - local_9c0.begin.z) * local_9c0.kstride;
            local_9c0.end.y = (int)lVar21;
            local_9c0.end.z = (int)lVar29;
            local_a00.p = (this_07->m_edgetype)._M_elems[2].dptr;
            local_a00.ncomp = (this_07->m_edgetype)._M_elems[2].nvar;
            pBVar1 = &(this_07->m_edgetype)._M_elems[2].domain;
            local_a00.begin.z = (this_07->m_edgetype)._M_elems[2].domain.smallend.vect[2];
            local_a00.begin.x = (pBVar1->smallend).vect[0];
            local_a00.begin.y = (pBVar1->smallend).vect[1];
            lVar21 = (long)(this_07->m_edgetype)._M_elems[2].domain.bigend.vect[1] + 1;
            lVar29 = (long)(this_07->m_edgetype)._M_elems[2].domain.bigend.vect[0];
            lVar31 = (long)(this_07->m_edgetype)._M_elems[2].domain.bigend.vect[2] + 1;
            local_a00.jstride = (lVar29 - (pBVar1->smallend).vect[0]) + 1;
            local_a00.kstride =
                 (lVar21 - (this_07->m_edgetype)._M_elems[2].domain.smallend.vect[1]) *
                 local_a00.jstride;
            local_a00.nstride = (lVar31 - local_a00.begin.z) * local_a00.kstride;
            local_a00.end._0_8_ = lVar29 + 1U & 0xffffffff | lVar21 << 0x20;
            local_a00.end.z = (int)lVar31;
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (&local_7c8,(FabArray<amrex::FArrayBox> *)local_c68,(MFIter *)&lhs);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((Array4<double> *)local_808,
                       &(this->super_Level).m_edgecent._M_elems[1].super_FabArray<amrex::FArrayBox>,
                       (MFIter *)&lhs);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (&local_848,
                       &(this->super_Level).m_edgecent._M_elems[2].super_FabArray<amrex::FArrayBox>,
                       (MFIter *)&lhs);
            bx.bigend.vect[1] = (int)local_980.kstride;
            bx.bigend.vect[2] = (int)((ulong)local_980.kstride >> 0x20);
            bx.smallend.vect[0] = (int)local_980.p;
            bx.smallend.vect[1] = (int)((ulong)local_980.p >> 0x20);
            bx.smallend.vect[2] = (int)local_980.jstride;
            bx.bigend.vect[0] = (int)((ulong)local_980.jstride >> 0x20);
            if ((uint)local_ea8 == 0) {
              local_738._16_4_ = local_7c8.begin.x;
              local_738._20_4_ = local_7c8.begin.y;
              local_738._0_8_ = local_7c8.kstride;
              local_738._8_8_ = local_7c8.nstride;
              edge_type.vect._0_8_ = local_7c8.p;
              stack0xfffffffffffff8c0 = (pointer)local_7c8.jstride;
              peStack_6e8 = (element_type *)local_808._32_8_;
              local_6f8 = (element_type *)local_808._16_8_;
              _Stack_6f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_808._24_8_;
              local_738._48_8_ = local_808._0_8_;
              local_738._56_8_ = local_808._8_8_;
              aDStack_6a8[0].x = local_848.begin.x;
              aDStack_6a8[0].y = local_848.begin.y;
              local_6b8 = (pointer)local_848.kstride;
              p_Stack_6b0 = (_Bit_type *)local_848.nstride;
              local_6c8 = local_848.p;
              piStack_6c0 = (pointer)local_848.jstride;
              stack0xfffffffffffff550 = local_980.nstride;
              GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::CylinderIF,_amrex::EB2::CylinderIF>,_int>
              ::
              getIntercept<amrex::EB2::DifferenceIF<amrex::EB2::CylinderIF,_amrex::EB2::CylinderIF>,_nullptr>
                        ((GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::CylinderIF,_amrex::EB2::CylinderIF>,_int>
                          *)local_eb8,(Array<Array4<Real>,_3> *)&edge_type,
                         (Array<Array4<const_Type_t>,_3> *)&bx,(Array4<const_double> *)&crse_ratio,
                         (Geometry *)local_ed8,Cpu,&bounding_box);
            }
            else {
              local_738._16_4_ = local_7c8.begin.x;
              local_738._20_4_ = local_7c8.begin.y;
              local_738._0_8_ = local_7c8.kstride;
              local_738._8_8_ = local_7c8.nstride;
              edge_type.vect._0_8_ = local_7c8.p;
              stack0xfffffffffffff8c0 = (pointer)local_7c8.jstride;
              peStack_6e8 = (element_type *)local_808._32_8_;
              local_6f8 = (element_type *)local_808._16_8_;
              _Stack_6f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_808._24_8_;
              local_738._48_8_ = local_808._0_8_;
              local_738._56_8_ = local_808._8_8_;
              aDStack_6a8[0].x = local_848.begin.x;
              aDStack_6a8[0].y = local_848.begin.y;
              local_6b8 = (pointer)local_848.kstride;
              p_Stack_6b0 = (_Bit_type *)local_848.nstride;
              local_6c8 = local_848.p;
              piStack_6c0 = (pointer)local_848.jstride;
              stack0xfffffffffffff550 = local_980.nstride;
              GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::CylinderIF,_amrex::EB2::CylinderIF>,_int>
              ::updateIntercept((GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::CylinderIF,_amrex::EB2::CylinderIF>,_int>
                                 *)local_eb8,(Array<Array4<Real>,_3> *)&edge_type,
                                (Array<Array4<const_Type_t>,_3> *)&bx,
                                (Array4<const_double> *)&crse_ratio,(Geometry *)local_ed8);
            }
            lVar21 = 0;
            do {
              BaseFab<double>::resize
                        ((BaseFab<double> *)
                         ((long)&pp.m_pstack.c.
                                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Deque_impl_data._M_map + lVar21),
                         (Box *)((long)pGVar8[iVar18].m_facetype._M_elems[0].domain.smallend.vect +
                                lVar21),3,(Arena *)0x0);
              lVar21 = lVar21 + 0x48;
            } while (lVar21 != 0xd8);
            local_738._20_4_ =
                 pp.m_pstack.c.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_first._4_4_;
            local_738._16_4_ =
                 (int)pp.m_pstack.c.
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_first;
            edge_type.vect._0_8_ =
                 pp.m_pstack.c.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
            register0x00000088 =
                 (pointer)(((long)pp.m_pstack.c.
                                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_last._4_4_ -
                           (long)(int)pp.m_pstack.c.
                                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_first) + 1);
            local_738._0_8_ =
                 (((long)(int)pp.m_pstack.c.
                              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_node + 1) -
                 (long)pp.m_pstack.c.
                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first._4_4_) *
                 (long)register0x00000088;
            local_738._8_8_ =
                 (((long)pp.m_pstack.c.
                         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_node._4_4_ + 1) -
                 (long)(int)pp.m_pstack.c.
                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_last) * local_738._0_8_;
            local_738._28_4_ =
                 pp.m_pstack.c.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last._4_4_ + 1;
            local_738._24_4_ =
                 (int)pp.m_pstack.c.
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last;
            local_738._32_4_ =
                 (undefined4)
                 ((long)(int)pp.m_pstack.c.
                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node + 1);
            local_738._40_4_ =
                 pp.m_pstack.c.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur._4_4_;
            local_738._36_4_ =
                 (int)((long)pp.m_pstack.c.
                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node._4_4_ + 1);
            bx.smallend.vect[0] = (int)local_c00._M_pi;
            bx.smallend.vect[1] = (int)((ulong)local_c00._M_pi >> 0x20);
            bx._8_8_ = ((long)local_bec - (long)local_bf8) + 1;
            bx.bigend.vect._4_8_ = (((long)local_be8 + 1) - (long)local_bf4) * bx._8_8_;
            register0x00000088 = (((long)local_be4 + 1) - (long)local_bf0) * bx.bigend.vect._4_8_;
            local_888.begin.y = local_bac[0].smallend.vect[0];
            local_888.begin.x = (int)local_bb0;
            local_888.p = local_bb8;
            local_888.jstride = ((long)local_bac[0].smallend.vect[2] - (long)(int)local_bb0) + 1;
            local_888.kstride =
                 (((long)local_bac[0].bigend.vect[0] + 1) - (long)local_bac[0].smallend.vect[0]) *
                 local_888.jstride;
            local_888.nstride =
                 (((long)local_bac[0].bigend.vect[1] + 1) - (long)local_bac[0].smallend.vect[1]) *
                 local_888.kstride;
            local_888.begin.z = local_bac[0].smallend.vect[1];
            local_888.end._0_8_ =
                 (long)local_bac[0].smallend.vect[2] + 1U & 0xffffffff |
                 (long)local_bac[0].bigend.vect[0] + 1 << 0x20;
            local_888.end.z = (int)((long)local_bac[0].bigend.vect[1] + 1);
            local_888.ncomp = local_bac[0].btype.itype;
            local_8c8.p = (EBCellFlag *)local_7c8.p;
            local_8c8.jstride = local_7c8.jstride;
            local_8c8.kstride = local_7c8.kstride;
            local_8c8.nstride = local_7c8.nstride;
            local_8c8.begin.z = local_7c8.begin.z;
            local_8c8.begin.x = local_7c8.begin.x;
            local_8c8.begin.y = local_7c8.begin.y;
            local_8c8.end.z = local_7c8.end.z;
            local_8c8.ncomp = local_7c8.ncomp;
            local_588._0_8_ = local_808._0_8_;
            local_588._8_8_ = local_808._8_8_;
            local_588._16_8_ = local_808._16_8_;
            local_588._24_8_ = local_808._24_8_;
            local_568.z = iStack_7e0;
            local_568.x = local_808._32_4_;
            local_568.y = local_808._36_4_;
            local_55c.z = iStack_7d4;
            local_550 = iStack_7d0;
            local_5c8.p = local_848.p;
            local_5c8.jstride = local_848.jstride;
            local_5c8.kstride = local_848.kstride;
            local_5c8.nstride = local_848.nstride;
            local_5c8.begin.z = local_848.begin.z;
            local_5c8.begin.x = local_848.begin.x;
            local_5c8.begin.y = local_848.begin.y;
            local_5c8.end.z = local_848.end.z;
            local_5c8.ncomp = local_848.ncomp;
            nmc = build_faces(&local_448,&local_788,&local_4c8,&local_508,&local_548,&local_980,
                              &local_9c0,&local_a00,&local_cc8,(Array4<const_double> *)&local_8c8,
                              (Array4<const_double> *)local_588,&local_5c8,&local_1c8,&local_208,
                              &local_248,&local_388,&local_3c8,&local_408,
                              (Array4<double> *)&edge_type,(Array4<double> *)&bx,&local_888,
                              &local_468,&local_488,cover_multiple_cuts);
            piVar24 = local_e78;
            if (local_e58 != (Vector<int,_std::allocator<int>_> *)0x0) {
              piVar24 = (local_e58->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + local_e78[0];
            }
            BaseFab<amrex::EBCellFlag>::resize
                      ((BaseFab<amrex::EBCellFlag> *)&result,
                       &((this->super_Level).m_cellflag.m_fabs_v.
                         super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[*piVar24]->
                        super_BaseFab<amrex::EBCellFlag>).domain,1,(Arena *)0x0);
            arena = (Arena *)CONCAT44(result.bigend.vect[0],result.smallend.vect[2]);
            if (arena == (Arena *)0x0) {
              arena = The_Arena();
            }
            Gpu::Elixir::Elixir(&cellflagtmp_eli,(void *)0x0,arena);
            local_8c8.p = (EBCellFlag *)CONCAT44(result.bigend.vect[2],result.bigend.vect[1]);
            local_8c8.begin.y = 1;
            local_8c8.begin.x = result.btype.itype;
            local_8c8.jstride = 1 - (long)(int)result.btype.itype;
            local_8c8.kstride = 0;
            local_8c8.nstride = 0;
            local_8c8.begin.z = 1;
            local_8c8.end.x = 1;
            local_8c8.end.y = 1;
            local_8c8.end.z = 1;
            local_8c8.ncomp = 0;
            local_588._0_8_ = local_388.p;
            local_588._8_8_ = local_388.jstride;
            local_588._16_8_ = local_388.kstride;
            local_588._24_8_ = local_388.nstride;
            local_568.z = local_388.begin.z;
            local_568.x = local_388.begin.x;
            local_568.y = local_388.begin.y;
            local_55c.z = local_388.end.z;
            local_55c.x = local_388.end.x;
            local_55c.y = local_388.end.y;
            local_550 = local_388.ncomp;
            local_5c8.p = local_3c8.p;
            local_5c8.jstride = local_3c8.jstride;
            local_5c8.kstride = local_3c8.kstride;
            local_5c8.nstride = local_3c8.nstride;
            local_5c8.begin.z = local_3c8.begin.z;
            local_5c8.begin.x = local_3c8.begin.x;
            local_5c8.begin.y = local_3c8.begin.y;
            local_5c8.end.z = local_3c8.end.z;
            local_5c8.end.x = local_3c8.end.x;
            local_5c8.end.y = local_3c8.end.y;
            local_5c8.ncomp = local_3c8.ncomp;
            local_288.p = local_408.p;
            local_288.jstride = local_408.jstride;
            local_288.kstride = local_408.kstride;
            local_288.nstride = local_408.nstride;
            local_288.begin.z = local_408.begin.z;
            local_288.begin.x = local_408.begin.x;
            local_288.begin.y = local_408.begin.y;
            local_288.end.z = local_408.end.z;
            local_288.end.x = local_408.end.x;
            local_288.end.y = local_408.end.y;
            local_288.ncomp = local_408.ncomp;
            local_2c8.p = (double *)edge_type.vect._0_8_;
            local_2c8.jstride = (Long)stack0xfffffffffffff8c0;
            local_2c8.kstride = local_738._0_8_;
            local_2c8.nstride = local_738._8_8_;
            local_2c8.begin.z = local_738._24_4_;
            local_2c8.begin.x = local_738._16_4_;
            local_2c8.begin.y = local_738._20_4_;
            local_2c8.end.z = local_738._36_4_;
            local_2c8.end.y = local_738._32_4_;
            local_2c8.end.x = local_738._28_4_;
            local_2c8.ncomp = local_738._40_4_;
            local_308.p = (double *)CONCAT44(bx.smallend.vect[1],bx.smallend.vect[0]);
            local_308.jstride._0_4_ = bx.smallend.vect[2];
            local_308.jstride._4_4_ = bx.bigend.vect[0];
            local_308.kstride._0_4_ = bx.bigend.vect[1];
            local_308.kstride._4_4_ = bx.bigend.vect[2];
            local_308.nstride = stack0xfffffffffffff550;
            local_348.p = local_888.p;
            local_348.jstride = local_888.jstride;
            local_348.kstride = local_888.kstride;
            local_348.nstride = local_888.nstride;
            local_348.begin.z = local_888.begin.z;
            local_348.begin.x = local_888.begin.x;
            local_348.begin.y = local_888.begin.y;
            local_348.end.z = local_888.end.z;
            local_348.end.x = local_888.end.x;
            local_348.end.y = local_888.end.y;
            local_348.ncomp = local_888.ncomp;
            local_308.end._0_8_ = (long)local_bec + 1U & 0xffffffff | (long)local_be8 + 1 << 0x20;
            local_308.end.z = (int)((long)local_be4 + 1);
            build_cells(&local_448,&local_788,&local_4c8,&local_508,&local_548,&local_1c8,&local_208
                        ,&local_248,(Array4<const_double> *)local_588,&local_5c8,&local_288,
                        &local_2c8,&local_308,&local_348,&local_70,&local_b0,&local_f0,&local_130,
                        &local_170,&local_8c8,&local_cc8,small_volfrac,(Geometry *)local_ed8,
                        (bool)(char)local_ec0,cover_multiple_cuts,&nsm,&nmc);
            nsmallcells = nsmallcells + nsm;
            nmulticuts = nmulticuts + nmc;
            Gpu::Elixir::~Elixir(&cellflagtmp_eli);
            MFIter::operator++((MFIter *)&lhs);
          } while (local_e78[0] < local_e70);
        }
        piVar33 = &pp.m_pstack.c.
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_start;
        MFIter::~MFIter((MFIter *)&lhs);
        std::
        _Rb_tree<amrex::Box,_std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>,_std::_Select1st<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_>,_std::less<amrex::Box>,_std::allocator<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_>_>
        ::~_Rb_tree(&local_d40);
        result.smallend.vect._0_8_ = &PTR__BaseFab_0080c150;
        BaseFab<amrex::EBCellFlag>::clear((BaseFab<amrex::EBCellFlag> *)&result);
        lVar21 = 0x90;
        do {
          this_08 = (BaseFab<double> *)
                    ((long)&pp.m_pstack.c.
                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_map + lVar21);
          this_08->_vptr_BaseFab = (_func_int **)&PTR__BaseFab_0080bbd8;
          BaseFab<double>::clear(this_08);
          lVar21 = lVar21 + -0x48;
        } while (lVar21 != -0x48);
        pp.m_pstack.c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map_size = (size_t)&nmulticuts;
        pp.m_pstack.c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&nsmallcells;
        __l._M_len = 2;
        __l._M_array = (iterator)&pp;
        std::vector<std::reference_wrapper<int>,_std::allocator<std::reference_wrapper<int>_>_>::
        vector(&local_420,__l,(allocator_type *)&edge_type);
        if (local_420.
            super__Vector_base<std::reference_wrapper<int>,_std::allocator<std::reference_wrapper<int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_420.
                          super__Vector_base<std::reference_wrapper<int>,_std::allocator<std::reference_wrapper<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_420.
                                super__Vector_base<std::reference_wrapper<int>,_std::allocator<std::reference_wrapper<int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_420.
                                super__Vector_base<std::reference_wrapper<int>,_std::allocator<std::reference_wrapper<int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (nmulticuts == 0 && nsmallcells == 0) break;
        MultiGFab::getLevelSet((MultiFab *)&edge_type,fabarray_);
        PVar35 = Geometry::periodicity((Geometry *)local_ed8);
        pp.m_pstack.c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._0_12_ = PVar35.period.vect;
        FabArray<amrex::FArrayBox>::FillBoundary<double>
                  ((FabArray<amrex::FArrayBox> *)&edge_type,(Periodicity *)&pp,false);
        iVar18 = Verbose();
        if (0 < iVar18) {
          cVar9 = (char)piVar33;
          if (nsmallcells != 0) {
            pp.m_pstack.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_map_size = (size_t)OutStream();
            pp.m_pstack.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_map._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
            pp.m_pstack.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_map._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)piVar33);
            *(undefined8 *)
             ((long)&pp.m_pstack.c.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_first +
             pp.m_pstack.c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur[-1]._M_string_length) =
                 *(undefined8 *)
                  (pp.m_pstack.c.
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_map_size + 8 +
                  *(long *)(*(long *)pp.m_pstack.c.
                                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Deque_impl_data._M_map_size + -0x18));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)piVar33,"AMReX EB: Iter. ",0x10);
            std::ostream::operator<<(piVar33,(int)local_ea8 + 1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar33," fixed ",7);
            std::ostream::operator<<(piVar33,nsmallcells);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)piVar33," small cells",0xc);
            std::ios::widen((char)pp.m_pstack.c.
                                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur[-1].
                                  _M_string_length + cVar9);
            std::ostream::put(cVar9);
            std::ostream::flush();
            Print::~Print((Print *)&pp);
          }
          if (nmulticuts != 0) {
            pp.m_pstack.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_map_size = (size_t)OutStream();
            pp.m_pstack.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_map._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
            pp.m_pstack.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_map._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)piVar33);
            *(undefined8 *)
             ((long)&pp.m_pstack.c.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_first +
             pp.m_pstack.c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur[-1]._M_string_length) =
                 *(undefined8 *)
                  (pp.m_pstack.c.
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_map_size + 8 +
                  *(long *)(*(long *)pp.m_pstack.c.
                                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Deque_impl_data._M_map_size + -0x18));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)piVar33,"AMReX EB: Iter. ",0x10);
            std::ostream::operator<<(piVar33,(int)local_ea8 + 1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar33," fixed ",7);
            std::ostream::operator<<(piVar33,nmulticuts);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar33," multicuts",10);
            std::ios::widen((char)pp.m_pstack.c.
                                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur[-1].
                                  _M_string_length + cVar9);
            std::ostream::put(cVar9);
            std::ostream::flush();
            Print::~Print((Print *)&pp);
          }
        }
        MultiFab::~MultiFab((MultiFab *)&edge_type);
        uVar25 = (int)local_ea8 + 1;
        local_ea8 = (ulong)uVar25;
      } while ((int)uVar25 < maxiter);
    }
    if (maxiter <= (int)(uint)local_ea8) {
      Assert_host("iter < maxiter",
                  "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EB2_Level.H"
                  ,0x1d1,"\"EB: failed to fix small cells\"");
    }
    MFIter::MFIter((MFIter *)&pp,(FabArrayBase *)fabarray_,'\0');
    if ((int)pp.m_pstack.c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last <
        (int)pp.m_pstack.c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node) {
      local_eb8 = &(this->super_Level).m_edgecent._M_elems[1].super_FabArray<amrex::FArrayBox>;
      local_ed8 = &(this->super_Level).m_edgecent._M_elems[2].super_FabArray<amrex::FArrayBox>;
      do {
        iVar18 = (int)pp.m_pstack.c.
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last;
        if (pp.m_pstack.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_last != (_Elt_pointer)0x0) {
          iVar18 = *(int *)(((pp.m_pstack.c.
                              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_last)->_M_dataplus)._M_p
                           + (long)(int)pp.m_pstack.c.
                                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_last * 4);
        }
        pGVar8 = (this->super_Level).m_mgf.super_LayoutData<amrex::EB2::GFab>.m_data.
                 super_vector<amrex::EB2::GFab,_std::allocator<amrex::EB2::GFab>_>.
                 super__Vector_base<amrex::EB2::GFab,_std::allocator<amrex::EB2::GFab>_>._M_impl.
                 super__Vector_impl_data._M_start;
        edge_type.vect._0_8_ = pGVar8[iVar18].m_levelset.dptr;
        iVar30 = pGVar8[iVar18].m_levelset.domain.smallend.vect[0];
        local_738._24_4_ = pGVar8[iVar18].m_levelset.domain.smallend.vect[2];
        iVar5 = pGVar8[iVar18].m_levelset.domain.smallend.vect[1];
        lVar21 = (long)pGVar8[iVar18].m_levelset.domain.bigend.vect[1] + 1;
        iVar6 = pGVar8[iVar18].m_levelset.domain.bigend.vect[0];
        lVar29 = (long)pGVar8[iVar18].m_levelset.domain.bigend.vect[2] + 1;
        register0x00000080 = (pointer)(((long)iVar6 - (long)iVar30) + 1);
        local_738._28_4_ = iVar6 + 1;
        local_738._0_8_ = (lVar21 - iVar5) * (long)register0x00000080;
        local_738._8_8_ = (lVar29 - (int)local_738._24_4_) * local_738._0_8_;
        local_738._20_4_ = iVar5;
        local_738._16_4_ = iVar30;
        local_738._32_4_ = (undefined4)lVar21;
        local_738._40_4_ = pGVar8[iVar18].m_levelset.nvar;
        local_738._36_4_ = (int)lVar29;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&bx,(FabArray<amrex::FArrayBox> *)local_c68,(MFIter *)&pp);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&result,local_eb8,(MFIter *)&pp);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&lhs,local_ed8,(MFIter *)&pp);
        crse_ratio.vect._0_8_ = pGVar8[iVar18].m_edgetype._M_elems[0].dptr;
        register0x00000080 =
             ((long)pGVar8[iVar18].m_edgetype._M_elems[0].domain.bigend.vect[0] -
             (long)pGVar8[iVar18].m_edgetype._M_elems[0].domain.smallend.vect[0]) + 1;
        local_cc8.p = (double *)pGVar8[iVar18].m_edgetype._M_elems[1].dptr;
        local_cc8.ncomp = pGVar8[iVar18].m_edgetype._M_elems[1].nvar;
        iVar30 = pGVar8[iVar18].m_edgetype._M_elems[1].domain.smallend.vect[0];
        local_cc8.begin.z = pGVar8[iVar18].m_edgetype._M_elems[1].domain.smallend.vect[2];
        iVar5 = pGVar8[iVar18].m_edgetype._M_elems[1].domain.smallend.vect[1];
        lVar21 = (long)pGVar8[iVar18].m_edgetype._M_elems[1].domain.bigend.vect[1] + 1;
        lVar29 = (long)pGVar8[iVar18].m_edgetype._M_elems[1].domain.bigend.vect[0];
        lVar31 = (long)pGVar8[iVar18].m_edgetype._M_elems[1].domain.bigend.vect[2] + 1;
        local_cc8.jstride = (lVar29 - iVar30) + 1;
        local_cc8.kstride = (lVar21 - iVar5) * local_cc8.jstride;
        local_cc8.nstride = (lVar31 - local_cc8.begin.z) * local_cc8.kstride;
        local_cc8.begin.y = iVar5;
        local_cc8.begin.x = iVar30;
        local_cc8.end._0_8_ = lVar29 + 1U & 0xffffffff | lVar21 << 0x20;
        local_cc8.end.z = (int)lVar31;
        local_788.p = (EBCellFlag *)pGVar8[iVar18].m_edgetype._M_elems[2].dptr;
        local_788.ncomp = pGVar8[iVar18].m_edgetype._M_elems[2].nvar;
        iVar30 = pGVar8[iVar18].m_edgetype._M_elems[2].domain.smallend.vect[0];
        local_788.begin.z = pGVar8[iVar18].m_edgetype._M_elems[2].domain.smallend.vect[2];
        iVar5 = pGVar8[iVar18].m_edgetype._M_elems[2].domain.smallend.vect[1];
        lVar21 = (long)pGVar8[iVar18].m_edgetype._M_elems[2].domain.bigend.vect[1] + 1;
        lVar29 = (long)pGVar8[iVar18].m_edgetype._M_elems[2].domain.bigend.vect[0];
        lVar31 = (long)pGVar8[iVar18].m_edgetype._M_elems[2].domain.bigend.vect[2] + 1;
        local_788.jstride = (lVar29 - iVar30) + 1;
        local_788.kstride = (lVar21 - iVar5) * local_788.jstride;
        local_788.nstride = (lVar31 - local_788.begin.z) * local_788.kstride;
        local_788.begin.y = iVar5;
        local_788.begin.x = iVar30;
        local_788.end._0_8_ = lVar29 + 1U & 0xffffffff | lVar21 << 0x20;
        local_788.end.z = (int)lVar31;
        intercept_to_edge_centroid
                  ((Array4<double> *)&bx,(Array4<double> *)&result,(Array4<double> *)&lhs,
                   (Array4<const_unsigned_int> *)&crse_ratio,
                   (Array4<const_unsigned_int> *)&local_cc8,(Array4<const_unsigned_int> *)&local_788
                   ,(Array4<const_double> *)&edge_type,&local_468,&local_488);
        MFIter::operator++((MFIter *)&pp);
      } while ((int)pp.m_pstack.c.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last <
               (int)pp.m_pstack.c.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node);
    }
    MFIter::~MFIter((MFIter *)&pp);
    MultiGFab::getLevelSet((MultiFab *)&pp,fabarray_);
    FabArray<amrex::FArrayBox>::operator=
              (&(this->super_Level).m_levelset.super_FabArray<amrex::FArrayBox>,
               (FabArray<amrex::FArrayBox> *)&pp);
    MultiFab::~MultiFab((MultiFab *)&pp);
    (this->super_Level).m_ok = true;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&mf_info.tags.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  }
  if (covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                          .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                          .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
GShopLevel<G>::define_fine (G const& gshop, const Geometry& geom,
                            int max_grid_size, int ngrow, bool extend_domain_face, int num_crse_opt)
{
    if (amrex::Verbose() > 0 && extend_domain_face == false) {
        amrex::Print() << "AMReX WARNING: extend_domain_face=false is not recommended!\n";
    }

    BL_PROFILE("EB2::GShopLevel()-fine");

#ifdef AMREX_USE_FLOAT
    Real small_volfrac = 1.e-5_rt;
#else
    Real small_volfrac = 1.e-14;
#endif
    bool cover_multiple_cuts = false;
    int maxiter = 32;
    {
        ParmParse pp("eb2");
        pp.queryAdd("small_volfrac", small_volfrac);
        pp.queryAdd("cover_multiple_cuts", cover_multiple_cuts);
        pp.queryAdd("maxiter", maxiter);
    }

    // make sure ngrow is multiple of 16
    m_ngrow = IntVect{static_cast<int>(std::ceil(ngrow/16.)) * 16};

    Box const& domain = geom.Domain();
    Box domain_grown = domain;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (geom.isPeriodic(idim)) {
            m_ngrow[idim] = 0;
        } else {
            m_ngrow[idim] = std::min(m_ngrow[idim], domain_grown.length(idim));
        }
    }
    domain_grown.grow(m_ngrow);
    Box bounding_box = (extend_domain_face) ? domain : domain_grown;
    bounding_box.surroundingNodes();

    BoxList cut_boxes;
    BoxList covered_boxes;

    const int nprocs = ParallelDescriptor::NProcs();
    const int iproc = ParallelDescriptor::MyProc();

    num_crse_opt = std::max(0,std::min(8,num_crse_opt));
    for (int clev = num_crse_opt; clev >= 0; --clev) {
        IntVect crse_ratio(1 << clev);
        if (domain.coarsenable(crse_ratio)) {
            Box const& crse_bounding_box = amrex::coarsen(bounding_box, crse_ratio);
            Geometry const& crse_geom = amrex::coarsen(geom, crse_ratio);
            BoxList test_boxes;
            if (cut_boxes.isEmpty()) {
                covered_boxes.clear();
                test_boxes = BoxList(crse_geom.Domain());
                test_boxes.maxSize(max_grid_size);
            } else {
                test_boxes.swap(cut_boxes);
                test_boxes.coarsen(crse_ratio);
                test_boxes.maxSize(max_grid_size);
            }

            const Long nboxes = test_boxes.size();
            const auto& boxes = test_boxes.data();
            for (Long i = iproc; i < nboxes; i += nprocs) {
                const Box& vbx = boxes[i];
                const Box& gbx = amrex::surroundingNodes(amrex::grow(vbx,1));
                auto box_type = gshop.getBoxType(gbx&crse_bounding_box,crse_geom,RunOn::Gpu);
                if (box_type == gshop.allcovered) {
                    covered_boxes.push_back(amrex::refine(vbx, crse_ratio));
                } else if (box_type == gshop.mixedcells) {
                    cut_boxes.push_back(amrex::refine(vbx, crse_ratio));
                }
            }

            amrex::AllGatherBoxes(cut_boxes.data());
        }
    }

    amrex::AllGatherBoxes(covered_boxes.data());

    if (m_ngrow != 0) {
        auto grow_at_domain_boundary = [&] (BoxList& bl)
        {
            const IntVect& domlo = domain.smallEnd();
            const IntVect& domhi = domain.bigEnd();
            for (auto& b : bl) {
                for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                    if (m_ngrow[idim] != 0) {
                        if (b.smallEnd(idim) == domlo[idim]) {
                            b.growLo(idim,m_ngrow[idim]);
                        }
                        if (b.bigEnd(idim) == domhi[idim]) {
                            b.growHi(idim,m_ngrow[idim]);
                        }
                    }
                }
            }
        };
        grow_at_domain_boundary(covered_boxes);
        grow_at_domain_boundary(cut_boxes);
    }

    if ( cut_boxes.isEmpty() &&
        !covered_boxes.isEmpty())
    {
        amrex::Abort("AMReX_EB2_Level.H: Domain is completely covered");
    }

    if (!covered_boxes.isEmpty()) {
        if (num_crse_opt > 2) { // don't want the box too big
            covered_boxes.maxSize(max_grid_size*4);
        }
        m_covered_grids = BoxArray(std::move(covered_boxes));
    }

    if (cut_boxes.isEmpty()) {
        m_grids = BoxArray();
        m_dmap = DistributionMapping();
        m_allregular = true;
        m_ok = true;
        return;
    }

    m_grids = BoxArray(std::move(cut_boxes));
    m_dmap = DistributionMapping(m_grids);

    m_mgf.define(m_grids, m_dmap);
    const int ng = GFab::ng;
    MFInfo mf_info;
    mf_info.SetTag("EB2::Level");
    m_cellflag.define(m_grids, m_dmap, 1, ng, mf_info);
    m_volfrac.define(m_grids, m_dmap, 1, ng, mf_info);
    m_centroid.define(m_grids, m_dmap, AMREX_SPACEDIM, ng, mf_info);
    m_bndryarea.define(m_grids, m_dmap, 1, ng, mf_info);
    m_bndrycent.define(m_grids, m_dmap, AMREX_SPACEDIM, ng, mf_info);
    m_bndrynorm.define(m_grids, m_dmap, AMREX_SPACEDIM, ng, mf_info);
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        m_areafrac[idim].define(amrex::convert(m_grids, IntVect::TheDimensionVector(idim)),
                                m_dmap, 1, ng, mf_info);
        m_facecent[idim].define(amrex::convert(m_grids, IntVect::TheDimensionVector(idim)),
                                m_dmap, AMREX_SPACEDIM-1, ng, mf_info);
        IntVect edge_type{1}; edge_type[idim] = 0;
        m_edgecent[idim].define(amrex::convert(m_grids, edge_type), m_dmap, 1, ng, mf_info);
    }

    const auto dx = geom.CellSizeArray();
    const auto problo = geom.ProbLoArray();

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (!extend_domain_face || geom.isPeriodic(idim)) {
            bounding_box.grow(idim,GFab::ng);
        }
    }

    RunOn gshop_run_on = (Gpu::inLaunchRegion() && gshop.isGPUable())
        ? RunOn::Gpu : RunOn::Cpu;

    bool hybrid = Gpu::inLaunchRegion() && (gshop_run_on == RunOn::Cpu);

    int iter = 0;
    for (; iter < maxiter; ++iter)
    {
        int nsmallcells = 0;
        int nmulticuts = 0;
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion()) reduction(+:nsmallcells,nmulticuts)
#endif
        {
#if (AMREX_SPACEDIM == 3)
            Array<BaseFab<Real>, AMREX_SPACEDIM> M2;
            EBCellFlagFab cellflagtmp;
#endif
            for (MFIter mfi(m_mgf); mfi.isValid(); ++mfi)
            {
                auto& gfab = m_mgf[mfi];
                const Box& vbx = gfab.validbox();

                auto& levelset = gfab.getLevelSet();
                if (iter == 0) {
                    gshop.fillFab(levelset, geom, gshop_run_on, bounding_box);
                    if (hybrid) {
                        levelset.prefetchToDevice();
                    }
                }

                auto& cellflag = m_cellflag[mfi];

                gfab.buildTypes(cellflag);

                Array4<Real const> const& clst = levelset.const_array();
                Array4<Real      > const&  lst = levelset.array();
                Array4<EBCellFlag> const& cfg = m_cellflag.array(mfi);
                Array4<Real> const& vfr = m_volfrac.array(mfi);
                Array4<Real> const& ctr = m_centroid.array(mfi);
                Array4<Real> const& bar = m_bndryarea.array(mfi);
                Array4<Real> const& bct = m_bndrycent.array(mfi);
                Array4<Real> const& bnm = m_bndrynorm.array(mfi);
                AMREX_D_TERM(Array4<Real> const& apx = m_areafrac[0].array(mfi);,
                             Array4<Real> const& apy = m_areafrac[1].array(mfi);,
                             Array4<Real> const& apz = m_areafrac[2].array(mfi););
                AMREX_D_TERM(Array4<Real> const& fcx = m_facecent[0].array(mfi);,
                             Array4<Real> const& fcy = m_facecent[1].array(mfi);,
                             Array4<Real> const& fcz = m_facecent[2].array(mfi););

                auto& facetype = gfab.getFaceType();
                AMREX_D_TERM(Array4<Type_t> const& ftx = facetype[0].array();,
                             Array4<Type_t> const& fty = facetype[1].array();,
                             Array4<Type_t> const& ftz = facetype[2].array(););

                int nmc = 0;
                int nsm = 0;

#if (AMREX_SPACEDIM == 3)
                auto& edgetype = gfab.getEdgeType();
                Array4<Type_t const> const& xdg = edgetype[0].const_array();
                Array4<Type_t const> const& ydg = edgetype[1].const_array();
                Array4<Type_t const> const& zdg = edgetype[2].const_array();

                Array4<Real> const& xip = m_edgecent[0].array(mfi);
                Array4<Real> const& yip = m_edgecent[1].array(mfi);
                Array4<Real> const& zip = m_edgecent[2].array(mfi);

                if (iter == 0) {
                    if (hybrid) {
                        Gpu::streamSynchronize();
                        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                            edgetype[idim].prefetchToHost();
                            m_edgecent[idim][mfi].prefetchToHost();
                        }
                    }

                    gshop.getIntercept({xip,yip,zip}, {xdg,ydg,zdg}, clst,
                                       geom, gshop_run_on, bounding_box);

                    if (hybrid) {
                        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                            edgetype[idim].prefetchToDevice();
                            m_edgecent[idim][mfi].prefetchToDevice();
                        }
                    }
                } else {
                    gshop.updateIntercept({xip,yip,zip}, {xdg,ydg,zdg}, clst, geom);
                }

                for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                    const Box& b = facetype[idim].box();
                    M2[idim].resize(b,3);
                }
                Array4<Real> const& xm2 = M2[0].array();
                Array4<Real> const& ym2 = M2[1].array();
                Array4<Real> const& zm2 = M2[2].array();

                nmc = build_faces(vbx, cfg, ftx, fty, ftz, xdg, ydg, zdg, lst,
                                  xip, yip, zip, apx, apy, apz, fcx, fcy, fcz,
                                  xm2, ym2, zm2, dx, problo, cover_multiple_cuts);

                cellflagtmp.resize(m_cellflag[mfi].box());
                Elixir cellflagtmp_eli = cellflagtmp.elixir();
                Array4<EBCellFlag> const& cfgtmp = cellflagtmp.array();

                build_cells(vbx, cfg, ftx, fty, ftz, apx, apy, apz,
                            fcx, fcy, fcz, xm2, ym2, zm2, vfr, ctr,
                            bar, bct, bnm, cfgtmp, lst,
                            small_volfrac, geom, extend_domain_face, cover_multiple_cuts,
                            nsm, nmc);

                // Becasue it is used in a synchronous reduction kernel in
                // build_cells, we do not need to worry about M2's lifetime.
                // But we still need to use Elixir to extend the life of
                // cellflagtmp.

#elif (AMREX_SPACEDIM == 2)
                Array4<Real> const& xip = m_edgecent[0].array(mfi);
                Array4<Real> const& yip = m_edgecent[1].array(mfi);

                if (iter == 0) {
                    if (hybrid) {
                        Gpu::streamSynchronize();
                        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                            facetype[idim].prefetchToHost();
                            m_edgecent[idim][mfi].prefetchToHost();
                        }
                    }

                    //                         yes, factype[1] and then [0]
                    gshop.getIntercept({xip,yip},
                                       {facetype[1].const_array(), facetype[0].const_array()},
                                       clst, geom, gshop_run_on, bounding_box);

                    if (hybrid) {
                        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                            facetype[idim].prefetchToDevice();
                            m_edgecent[idim][mfi].prefetchToDevice();
                        }
                    }
                } else {
                    gshop.updateIntercept({xip,yip},
                                          {facetype[1].const_array(), facetype[0].const_array()},
                                          clst, geom);
                }

                nmc = build_faces(vbx, cfg, ftx, fty, clst, xip, yip, apx, apy, fcx, fcy,
                                  dx, problo, cover_multiple_cuts);

                build_cells(vbx, cfg, ftx, fty, apx, apy, vfr, ctr,
                            bar, bct, bnm, lst, small_volfrac, geom, extend_domain_face,
                            nsm, nmc);
#endif
                nsmallcells += nsm;
                nmulticuts  += nmc;
            }
        }

        ParallelAllReduce::Sum<int>({nsmallcells,nmulticuts}, ParallelContext::CommunicatorSub());
        if (nsmallcells == 0 && nmulticuts == 0) {
            break;
        } else {
            auto ls = m_mgf.getLevelSet();
            // This is an alias MulitFab, therefore FillBoundary on it is fine.
            ls.FillBoundary(geom.periodicity());
            if (amrex::Verbose() > 0) {
                if (nsmallcells) {
                    amrex::Print() << "AMReX EB: Iter. " << iter+1 << " fixed " << nsmallcells
                                   << " small cells" << std::endl;
                }
                if (nmulticuts) {
                    amrex::Print() << "AMReX EB: Iter. " << iter+1 << " fixed " << nmulticuts
                                   << " multicuts" << std::endl;
                }
            }
        }
    }

    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(iter < maxiter, "EB: failed to fix small cells");

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(m_mgf); mfi.isValid(); ++mfi)
    {
        auto& gfab = m_mgf[mfi];
        auto const& levelset = gfab.getLevelSet();
        Array4<Real const> const& clst = levelset.const_array();

        AMREX_D_TERM(Array4<Real> const& xip = m_edgecent[0].array(mfi);,
                     Array4<Real> const& yip = m_edgecent[1].array(mfi);,
                     Array4<Real> const& zip = m_edgecent[2].array(mfi);)
#if (AMREX_SPACEDIM == 3)
        auto const& edgetype = gfab.getEdgeType();
        Array4<Type_t const> const& xdg = edgetype[0].const_array();
        Array4<Type_t const> const& ydg = edgetype[1].const_array();
        Array4<Type_t const> const& zdg = edgetype[2].const_array();

        intercept_to_edge_centroid(xip, yip, zip, xdg, ydg, zdg, clst, dx, problo);

#elif (AMREX_SPACEDIM == 2)
        auto& facetype = gfab.getFaceType();
        Array4<Type_t const> const& ftx = facetype[0].const_array();
        Array4<Type_t const> const& fty = facetype[1].const_array();
        //                                  fty then ftx
        intercept_to_edge_centroid(xip, yip, fty, ftx, clst, dx, problo);
#endif
    }

    m_levelset = m_mgf.getLevelSet();

    m_ok = true;
}